

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzidentifyrefpattern.cpp
# Opt level: O2

int __thiscall TPZIdentifyRefPattern::UniformSubElem(TPZIdentifyRefPattern *this,int eltype)

{
  int iVar1;
  ostream *poVar2;
  
  if ((uint)eltype < 8) {
    iVar1 = *(int *)(&DAT_0136296c + (ulong)(uint)eltype * 4);
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cerr,
                             "TPZIdentifyRefPattern::UniformSubElem ERROR unknown eltype : ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,eltype);
    std::endl<char,std::char_traits<char>>(poVar2);
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

int TPZIdentifyRefPattern::UniformSubElem( int eltype){
	switch (eltype) {
		case (EPoint)         : return TPZRefPoint::NSubEl;
		case (EOned)          : return TPZRefLinear::NSubEl;
		case (ETriangle)      : return TPZRefTriangle::NSubEl;
		case (EQuadrilateral) : return TPZRefQuad::NSubEl;
		case (ETetraedro)     : return TPZRefTetrahedra::NSubEl;
		case (EPiramide)      : return TPZRefPyramid::NSubEl;
		case (EPrisma)        : return TPZRefPrism::NSubEl;
		case (ECube)          : return TPZRefCube::NSubEl;
	}
	PZError << "TPZIdentifyRefPattern::UniformSubElem ERROR unknown eltype : " << eltype << endl;
	return (-1);
}